

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O0

void ZydisValidateEnumRanges
               (ZydisDecodedInstruction *insn,ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  ZydisOperandType ZVar1;
  uint local_30;
  uint local_2c;
  ZyanU32 i_2;
  ZyanU32 i_1;
  ZydisDecodedOperand *op;
  ZyanU32 i;
  ZyanU8 operand_count_local;
  ZydisDecodedOperand *operands_local;
  ZydisDecodedInstruction *insn_local;
  
  if (0xf < insn->length) {
    fprintf(_stderr,
            "Value insn->length = 0x%016lX is above expected max ZYDIS_MAX_INSTRUCTION_LENGTH = 0x%016lX\n"
            ,(ulong)insn->length,0xf);
    abort();
  }
  if (ZYDIS_MACHINE_MODE_MAX_VALUE < insn->machine_mode) {
    fprintf(_stderr,
            "Value insn->machine_mode = 0x%016lX is above expected max ZYDIS_MACHINE_MODE_MAX_VALUE = 0x%016lX\n"
            ,(ulong)insn->machine_mode,5);
    abort();
  }
  if (ZYDIS_MNEMONIC_MAX_VALUE < insn->mnemonic) {
    fprintf(_stderr,
            "Value insn->mnemonic = 0x%016lX is above expected max ZYDIS_MNEMONIC_MAX_VALUE = 0x%016lX\n"
            ,(ulong)insn->mnemonic,0x703);
    abort();
  }
  if (ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE < insn->encoding) {
    fprintf(_stderr,
            "Value insn->encoding = 0x%016lX is above expected max ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE = 0x%016lX\n"
            ,(ulong)insn->encoding,5);
    abort();
  }
  if (ZYDIS_OPCODE_MAP_MAX_VALUE < insn->opcode_map) {
    fprintf(_stderr,
            "Value insn->opcode_map = 0x%016lX is above expected max ZYDIS_OPCODE_MAP_MAX_VALUE = 0x%016lX\n"
            ,(ulong)insn->opcode_map,0xb);
    abort();
  }
  if (ZYDIS_OPCODE_MAP_MAX_VALUE < insn->opcode_map) {
    fprintf(_stderr,
            "Value insn->opcode_map = 0x%016lX is above expected max ZYDIS_OPCODE_MAP_MAX_VALUE = 0x%016lX\n"
            ,(ulong)insn->opcode_map,0xb);
    abort();
  }
  for (op._0_4_ = 0; (uint)op < operand_count; op._0_4_ = (uint)op + 1) {
    if (ZYDIS_OPERAND_TYPE_IMMEDIATE < operands[(uint)op].type) {
      fprintf(_stderr,
              "Value op->type = 0x%016lX is above expected max ZYDIS_OPERAND_TYPE_MAX_VALUE = 0x%016lX\n"
              ,(ulong)operands[(uint)op].type,4);
      abort();
    }
    if (ZYDIS_OPERAND_VISIBILITY_HIDDEN < operands[(uint)op].visibility) {
      fprintf(_stderr,
              "Value op->visibility = 0x%016lX is above expected max ZYDIS_OPERAND_VISIBILITY_MAX_VALUE = 0x%016lX\n"
              ,(ulong)operands[(uint)op].visibility,3);
      abort();
    }
    if (ZYDIS_OPERAND_ENCODING_JIMM16_32_32 < operands[(uint)op].encoding) {
      fprintf(_stderr,
              "Value op->encoding = 0x%016lX is above expected max ZYDIS_OPERAND_ENCODING_MAX_VALUE = 0x%016lX\n"
              ,(ulong)operands[(uint)op].encoding,0x22);
      abort();
    }
    if (ZYDIS_ELEMENT_TYPE_CC < operands[(uint)op].element_type) {
      fprintf(_stderr,
              "Value op->element_type = 0x%016lX is above expected max ZYDIS_ELEMENT_TYPE_MAX_VALUE = 0x%016lX\n"
              ,(ulong)operands[(uint)op].element_type,10);
      abort();
    }
    ZVar1 = operands[(uint)op].type;
    if (ZVar1 == ZYDIS_OPERAND_TYPE_REGISTER) {
      if (0x10a < operands[(uint)op].field_10.mem.type) {
        fprintf(_stderr,
                "Value op->reg.value = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
                ,(ulong)operands[(uint)op].field_10.mem.type,0x10a);
        abort();
      }
    }
    else if (ZVar1 == ZYDIS_OPERAND_TYPE_MEMORY) {
      if (ZYDIS_MEMOP_TYPE_MAX_VALUE < operands[(uint)op].field_10.mem.type) {
        fprintf(_stderr,
                "Value op->mem.type = 0x%016lX is above expected max ZYDIS_MEMOP_TYPE_MAX_VALUE = 0x%016lX\n"
                ,(ulong)operands[(uint)op].field_10.mem.type,4);
        abort();
      }
      if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < operands[(uint)op].field_10.mem.segment) {
        fprintf(_stderr,
                "Value op->mem.segment = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
                ,(ulong)operands[(uint)op].field_10.mem.segment,0x10a);
        abort();
      }
      if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < operands[(uint)op].field_10.mem.base) {
        fprintf(_stderr,
                "Value op->mem.base = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
                ,(ulong)operands[(uint)op].field_10.mem.base,0x10a);
        abort();
      }
      if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < operands[(uint)op].field_10.mem.index) {
        fprintf(_stderr,
                "Value op->mem.index = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
                ,(ulong)operands[(uint)op].field_10.mem.index,0x10a);
        abort();
      }
      ZydisValidateImmediateSize((ulong)*(byte *)((long)&operands[(uint)op].field_10 + 0x21));
      if ((uint)insn->length <
          (uint)*(byte *)((long)&operands[(uint)op].field_10 + 0x20) +
          *(byte *)((long)&operands[(uint)op].field_10 + 0x21) / 8) {
        fprintf(_stderr,
                "Value op->mem.disp.offset + (op->mem.disp.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
                ,(long)(int)((uint)*(byte *)((long)&operands[(uint)op].field_10 + 0x20) +
                            *(byte *)((long)&operands[(uint)op].field_10 + 0x21) / 8),
                (ulong)insn->length);
        abort();
      }
    }
    else if (ZVar1 == ZYDIS_OPERAND_TYPE_IMMEDIATE) {
      if (1 < operands[(uint)op].field_10.imm.is_signed) {
        fprintf(_stderr,
                "Value op->imm.is_signed = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n",
                (ulong)operands[(uint)op].field_10.imm.is_signed,1);
        abort();
      }
      if (1 < operands[(uint)op].field_10.imm.is_relative) {
        fprintf(_stderr,
                "Value op->imm.is_relative = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n",
                (ulong)operands[(uint)op].field_10.imm.is_relative,1);
        abort();
      }
      ZydisValidateImmediateSize((ulong)operands[(uint)op].field_10.imm.size);
      if ((uint)insn->length <
          (uint)operands[(uint)op].field_10.mem.scale + operands[(uint)op].field_10.imm.size / 8) {
        fprintf(_stderr,
                "Value op->imm.offset + (op->imm.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
                ,(long)(int)((uint)operands[(uint)op].field_10.mem.scale +
                            operands[(uint)op].field_10.imm.size / 8),(ulong)insn->length);
        abort();
      }
    }
  }
  if (ZYDIS_MASK_MODE_CONTROL_ZEROING < (insn->avx).mask.mode) {
    fprintf(_stderr,
            "Value insn->avx.mask.mode = 0x%016lX is above expected max ZYDIS_MASK_MODE_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->avx).mask.mode,5);
    abort();
  }
  if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < (insn->avx).mask.reg) {
    fprintf(_stderr,
            "Value insn->avx.mask.reg = 0x%016lX is above expected max ZYDIS_REGISTER_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->avx).mask.reg,0x10a);
    abort();
  }
  if (1 < (insn->avx).broadcast.is_static) {
    fprintf(_stderr,
            "Value insn->avx.broadcast.is_static = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n"
            ,(ulong)(insn->avx).broadcast.is_static,1);
    abort();
  }
  if (ZYDIS_BROADCAST_MODE_8_TO_16 < (insn->avx).broadcast.mode) {
    fprintf(_stderr,
            "Value insn->avx.broadcast.mode = 0x%016lX is above expected max ZYDIS_BROADCAST_MODE_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->avx).broadcast.mode,0xc);
    abort();
  }
  if (ZYDIS_ROUNDING_MODE_MAX_VALUE < (insn->avx).rounding.mode) {
    fprintf(_stderr,
            "Value insn->avx.rounding.mode = 0x%016lX is above expected max ZYDIS_ROUNDING_MODE_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->avx).rounding.mode,4);
    abort();
  }
  if (ZYDIS_SWIZZLE_MODE_DDDD < (insn->avx).swizzle.mode) {
    fprintf(_stderr,
            "Value insn->avx.swizzle.mode = 0x%016lX is above expected max ZYDIS_SWIZZLE_MODE_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->avx).swizzle.mode,8);
    abort();
  }
  if (ZYDIS_CONVERSION_MODE_MAX_VALUE < (insn->avx).conversion.mode) {
    fprintf(_stderr,
            "Value insn->avx.conversion.mode = 0x%016lX is above expected max ZYDIS_CONVERSION_MODE_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->avx).conversion.mode,5);
    abort();
  }
  if (1 < (insn->avx).has_sae) {
    fprintf(_stderr,
            "Value insn->avx.has_sae = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n",
            (ulong)(insn->avx).has_sae,1);
    abort();
  }
  if (1 < (insn->avx).has_eviction_hint) {
    fprintf(_stderr,
            "Value insn->avx.has_eviction_hint = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n"
            ,(ulong)(insn->avx).has_eviction_hint,1);
    abort();
  }
  if (ZYDIS_CATEGORY_MAX_VALUE < (insn->meta).category) {
    fprintf(_stderr,
            "Value insn->meta.category = 0x%016lX is above expected max ZYDIS_CATEGORY_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->meta).category,0x74);
    abort();
  }
  if (ZYDIS_ISA_SET_MAX_VALUE < (insn->meta).isa_set) {
    fprintf(_stderr,
            "Value insn->meta.isa_set = 0x%016lX is above expected max ZYDIS_ISA_SET_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->meta).isa_set,199);
    abort();
  }
  if ((insn->meta).isa_ext < 200) {
    if (ZYDIS_BRANCH_TYPE_FAR < (insn->meta).branch_type) {
      fprintf(_stderr,
              "Value insn->meta.branch_type = 0x%016lX is above expected max ZYDIS_BRANCH_TYPE_MAX_VALUE = 0x%016lX\n"
              ,(ulong)(insn->meta).branch_type,3);
      abort();
    }
    if ((insn->meta).exception_class < (ZYDIS_EXCEPTION_CLASS_AMXE5|ZYDIS_EXCEPTION_CLASS_SSE2)) {
      local_2c = 0;
      while( true ) {
        if (0xe < local_2c) {
          local_30 = 0;
          while( true ) {
            if (1 < local_30) {
              return;
            }
            if (1 < (insn->raw).imm[local_30].is_signed) break;
            if (1 < (insn->raw).imm[local_30].is_relative) {
              fprintf(_stderr,
                      "Value insn->raw.imm[i].is_relative = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n"
                      ,(ulong)(insn->raw).imm[local_30].is_relative,1);
              abort();
            }
            local_30 = local_30 + 1;
          }
          fprintf(_stderr,
                  "Value insn->raw.imm[i].is_signed = 0x%016lX is above expected max ZYAN_TRUE = 0x%016lX\n"
                  ,(ulong)(insn->raw).imm[local_30].is_signed,1);
          abort();
        }
        if (ZYDIS_PREFIX_TYPE_MANDATORY < (insn->raw).prefixes[local_2c].type) break;
        local_2c = local_2c + 1;
      }
      fprintf(_stderr,
              "Value insn->raw.prefixes[i].type = 0x%016lX is above expected max ZYDIS_PREFIX_TYPE_MAX_VALUE = 0x%016lX\n"
              ,(ulong)(insn->raw).prefixes[local_2c].type,2);
      abort();
    }
    fprintf(_stderr,
            "Value insn->meta.exception_class = 0x%016lX is above expected max ZYDIS_EXCEPTION_CLASS_MAX_VALUE = 0x%016lX\n"
            ,(ulong)(insn->meta).exception_class,0x2d);
    abort();
  }
  fprintf(_stderr,
          "Value insn->meta.isa_ext = 0x%016lX is above expected max ZYDIS_ISA_SET_MAX_VALUE = 0x%016lX\n"
          ,(ulong)(insn->meta).isa_ext,199);
  abort();
}

Assistant:

void ZydisValidateEnumRanges(const ZydisDecodedInstruction* insn,
    const ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#   define ZYDIS_CHECK_ENUM(value, max)                                                            \
    if ((ZyanU64)(value) > (ZyanU64)(max))                                                         \
    {                                                                                              \
        fprintf(stderr, "Value " #value " = 0x%016" PRIX64 " is above expected max " #max          \
            " = 0x%016" PRIX64 "\n", (ZyanU64)(value), (ZyanU64)(max));                            \
        abort();                                                                                   \
    }
#   define ZYDIS_CHECK_MAX ZYDIS_CHECK_ENUM

    ZYDIS_CHECK_ENUM(insn->length, ZYDIS_MAX_INSTRUCTION_LENGTH);

    ZYDIS_CHECK_ENUM(insn->machine_mode, ZYDIS_MACHINE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->mnemonic, ZYDIS_MNEMONIC_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->encoding, ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);

    // Operands.
    for (ZyanU32 i = 0; i < operand_count; ++i)
    {
        const ZydisDecodedOperand* op = &operands[i];
        ZYDIS_CHECK_ENUM(op->type, ZYDIS_OPERAND_TYPE_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->visibility, ZYDIS_OPERAND_VISIBILITY_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->encoding, ZYDIS_OPERAND_ENCODING_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->element_type, ZYDIS_ELEMENT_TYPE_MAX_VALUE);

        switch (op->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            ZYDIS_CHECK_ENUM(op->reg.value, ZYDIS_REGISTER_MAX_VALUE);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            ZYDIS_CHECK_ENUM(op->mem.type, ZYDIS_MEMOP_TYPE_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.segment, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.base, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.index, ZYDIS_REGISTER_MAX_VALUE);
            ZydisValidateImmediateSize(op->mem.disp.size);
            ZYDIS_CHECK_MAX(op->mem.disp.offset + (op->mem.disp.size / 8), insn->length);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            ZYDIS_CHECK_ENUM(op->imm.is_signed, ZYAN_TRUE);
            ZYDIS_CHECK_ENUM(op->imm.is_relative, ZYAN_TRUE);
            ZydisValidateImmediateSize(op->imm.size);
            ZYDIS_CHECK_MAX(op->imm.offset + (op->imm.size / 8), insn->length);
            break;
        default:
            break;
        }
    }

    // AVX.
    ZYDIS_CHECK_ENUM(insn->avx.mask.mode, ZYDIS_MASK_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.mask.reg, ZYDIS_REGISTER_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.is_static, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.mode, ZYDIS_BROADCAST_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.rounding.mode, ZYDIS_ROUNDING_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.swizzle.mode, ZYDIS_SWIZZLE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.conversion.mode, ZYDIS_CONVERSION_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_sae, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_eviction_hint, ZYAN_TRUE);

    // Meta.
    ZYDIS_CHECK_ENUM(insn->meta.category, ZYDIS_CATEGORY_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_set, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_ext, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.branch_type, ZYDIS_BRANCH_TYPE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.exception_class, ZYDIS_EXCEPTION_CLASS_MAX_VALUE);

    // Raw.
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.prefixes); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.prefixes[i].type, ZYDIS_PREFIX_TYPE_MAX_VALUE);
    }
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.imm); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_signed, ZYAN_TRUE);
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_relative, ZYAN_TRUE);
    }

#   undef ZYDIS_CHECK_ENUM
#   undef ZYDIS_CHECK_MAX
}